

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::Write3dmBitmap(ON_BinaryArchive *this,ON_Bitmap *bitmap)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  
  bVar1 = ArchiveContains3dmTable(this,bitmap_table);
  bVar2 = true;
  if (bVar1) {
    bVar1 = Internal_Begin3dmTableRecord(this,bitmap_table);
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, 1 < this->m_3dm_version)) {
      Internal_Increment3dmTableItemCount(this);
      lVar3 = (long)(this->m_chunk).m_count;
      pOVar4 = (this->m_chunk).m_a + lVar3;
      if ((pOVar4 == (ON_3DM_BIG_CHUNK *)0x28 || lVar3 < 1) || (pOVar4[-1].m_typecode != 0x10000016)
         ) {
        Internal_ReportCriticalError(this);
        bVar2 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2709,"",
                   "ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block"
                  );
      }
      else {
        bVar2 = false;
        bVar1 = BeginWrite3dmBigChunk(this,0x20008090,0);
        if (bVar1) {
          Internal_Write3dmUpdateManifest(this,&bitmap->super_ON_ModelComponent);
          bVar1 = WriteObject(this,(ON_Object *)bitmap);
          bVar2 = EndWrite3dmChunk(this);
          bVar2 = bVar2 && bVar1;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Write3dmBitmap( const ON_Bitmap& bitmap )
{
  if (false == ArchiveContains3dmTable(ON_3dmArchiveTableType::bitmap_table))
    return true;

  if ( false == Internal_Begin3dmTableRecord(ON_3dmArchiveTableType::bitmap_table) )
    return false;

  bool rc = false;
  if ( m_3dm_version > 1 ) 
  {
    Internal_Increment3dmTableItemCount();
    const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
    if ( c && c->m_typecode == TCODE_BITMAP_TABLE ) 
    {
      rc = BeginWrite3dmChunk( TCODE_BITMAP_RECORD, 0 );
      if ( rc )
      {
        Internal_Write3dmUpdateManifest(bitmap);
        rc = WriteObject( bitmap );
        if ( !EndWrite3dmChunk() )
          rc = false;
      }
    }
    else 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block");
      rc = false;
    }
  }
  return rc;
}